

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  RE *a_regex;
  char *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  char *in_RSI;
  string *__s;
  int in_R8D;
  undefined8 *in_R9;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_120 [48];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  InternalRunDeathTestFlag *local_48;
  UnitTestImpl *local_40;
  undefined8 *local_38;
  int local_2c;
  char *local_28;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_40 = GetUnitTestImpl();
  local_48 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x17e2d1);
  UnitTestImpl::current_test_info(local_40);
  iVar2 = TestInfo::increment_death_test_count((TestInfo *)0x17e2ee);
  local_4c = iVar2;
  if (local_48 != (InternalRunDeathTestFlag *)0x0) {
    pcVar4 = InternalRunDeathTestFlag::index(local_48,in_RSI,__c);
    if ((int)pcVar4 < iVar2) {
      StreamableToString<int>(in_stack_fffffffffffffe98);
      std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      __s = local_d0;
      std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
      InternalRunDeathTestFlag::index(local_48,(char *)__s,__c_00);
      StreamableToString<int>(in_stack_fffffffffffffe98);
      std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
      DeathTest::set_last_death_test_message((string *)0x17e3f0);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      return false;
    }
    InternalRunDeathTestFlag::file_abi_cxx11_(local_48);
    bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (((!bVar1) || (iVar3 = InternalRunDeathTestFlag::line(local_48), iVar3 != local_2c)) ||
       (pcVar4 = InternalRunDeathTestFlag::index(local_48,local_28,__c_01),
       in_stack_fffffffffffffe94 = iVar2, (int)pcVar4 != local_4c)) {
      *local_38 = 0;
      return true;
    }
  }
  bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (bVar1) {
    pcVar4 = (char *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest
              ((ExecDeathTest *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,
               (RE *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),pcVar4,
               (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    *local_38 = pcVar4;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (!bVar1) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
      DeathTest::set_last_death_test_message((string *)0x17e6e0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
      return false;
    }
    a_regex = (RE *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest
              ((NoExecDeathTest *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (char *)in_stack_fffffffffffffe78,a_regex);
    *local_38 = a_regex;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }